

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SliceStaticLayerParams::MergeFrom
          (SliceStaticLayerParams *this,SliceStaticLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_1a1;
  LogMessage local_1a0;
  LogMessage local_168;
  LogMessage local_130;
  LogMessage local_f8;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_168,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1052d);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_168,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_168);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_130,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_130,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_130);
  }
  iVar1 = (from->beginids_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve
              (&this->beginids_,iVar1 + (this->beginids_).current_size_);
    memcpy(((this->beginids_).rep_)->elements + (this->beginids_).current_size_,
           ((from->beginids_).rep_)->elements,(long)(from->beginids_).current_size_ << 3);
    (this->beginids_).current_size_ =
         (this->beginids_).current_size_ + (from->beginids_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_f8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_f8,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_f8);
  }
  iVar1 = (from->beginmasks_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve
              (&this->beginmasks_,iVar1 + (this->beginmasks_).current_size_);
    memcpy(((this->beginmasks_).rep_)->elements + (this->beginmasks_).current_size_,
           ((from->beginmasks_).rep_)->elements,(long)(from->beginmasks_).current_size_);
    (this->beginmasks_).current_size_ =
         (this->beginmasks_).current_size_ + (from->beginmasks_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c0,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  iVar1 = (from->endids_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve
              (&this->endids_,iVar1 + (this->endids_).current_size_);
    memcpy(((this->endids_).rep_)->elements + (this->endids_).current_size_,
           ((from->endids_).rep_)->elements,(long)(from->endids_).current_size_ << 3);
    (this->endids_).current_size_ = (this->endids_).current_size_ + (from->endids_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar1 = (from->endmasks_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve
              (&this->endmasks_,iVar1 + (this->endmasks_).current_size_);
    memcpy(((this->endmasks_).rep_)->elements + (this->endmasks_).current_size_,
           ((from->endmasks_).rep_)->elements,(long)(from->endmasks_).current_size_);
    (this->endmasks_).current_size_ =
         (this->endmasks_).current_size_ + (from->endmasks_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->strides_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve
              (&this->strides_,iVar1 + (this->strides_).current_size_);
    memcpy(((this->strides_).rep_)->elements + (this->strides_).current_size_,
           ((from->strides_).rep_)->elements,(long)(from->strides_).current_size_ << 3);
    (this->strides_).current_size_ = (this->strides_).current_size_ + (from->strides_).current_size_
    ;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_1a0,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_1a1,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1a0);
  }
  iVar1 = (from->squeezemasks_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve
              (&this->squeezemasks_,iVar1 + (this->squeezemasks_).current_size_);
    memcpy(((this->squeezemasks_).rep_)->elements + (this->squeezemasks_).current_size_,
           ((from->squeezemasks_).rep_)->elements,(long)(from->squeezemasks_).current_size_);
    (this->squeezemasks_).current_size_ =
         (this->squeezemasks_).current_size_ + (from->squeezemasks_).current_size_;
  }
  return;
}

Assistant:

void SliceStaticLayerParams::MergeFrom(const SliceStaticLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SliceStaticLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  beginids_.MergeFrom(from.beginids_);
  beginmasks_.MergeFrom(from.beginmasks_);
  endids_.MergeFrom(from.endids_);
  endmasks_.MergeFrom(from.endmasks_);
  strides_.MergeFrom(from.strides_);
  squeezemasks_.MergeFrom(from.squeezemasks_);
}